

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int get_attr(attr_list list,int index,atom_t *name,attr_value_type *val_type,attr_value *value)

{
  uint uVar1;
  int_attr_struct *piVar2;
  int iVar3;
  double dVar4;
  long lVar5;
  attr_list p_Var6;
  ulong uVar7;
  
  while (p_Var6 = list, p_Var6->list_of_lists != 0) {
    uVar1 = (p_Var6->l).lists.sublist_count;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    uVar7 = 0;
    while( true ) {
      if (uVar1 == uVar7) {
        return 0;
      }
      list = (p_Var6->l).lists.lists[uVar7];
      iVar3 = attr_count(list);
      if (index < iVar3) break;
      uVar7 = uVar7 + 1;
      index = index - iVar3;
    }
  }
  piVar2 = (p_Var6->l).list.iattrs;
  lVar5 = (long)index;
  if (index < (int)(uint)piVar2->int_attr_count) {
    *name = piVar2->iattr[lVar5].attr_id;
    *val_type = Attr_Int4;
    dVar4 = (double)(long)((p_Var6->l).list.iattrs)->iattr[lVar5].value;
  }
  else {
    lVar5 = lVar5 - (ulong)piVar2->int_attr_count;
    if ((int)(uint)piVar2->other_attr_count <= (int)lVar5) {
      return 0;
    }
    *name = (p_Var6->l).list.attributes[lVar5].attr_id;
    *val_type = (p_Var6->l).list.attributes[lVar5].val_type;
    dVar4 = (p_Var6->l).list.attributes[lVar5].value.u.d;
  }
  *value = (attr_value)dVar4;
  return 1;
}

Assistant:

int
get_attr(attr_list list,int index, atom_t *name,
	  attr_value_type *val_type, attr_value *value)
{
    if (!list->list_of_lists) {
	if (index < list->l.list.iattrs->int_attr_count) {
	    *name = list->l.list.iattrs->iattr[index].attr_id;
	    *val_type = Attr_Int4;
	    *value = (attr_value) (long) list->l.list.iattrs->iattr[index].value;
	    return 1;
	}
	index -= list->l.list.iattrs->int_attr_count;
	if (index < list->l.list.iattrs->other_attr_count) {
	    *name = list->l.list.attributes[index].attr_id;
	    *val_type = list->l.list.attributes[index].val_type;
	    *value = (int64_t)list->l.list.attributes[index].value.u.l;
	    return 1;
	}
	return 0;
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            int count = attr_count(list->l.lists.lists[i]);
            if (index < count) {
                return get_attr(list->l.lists.lists[i], index, name, 
				val_type, value);
            } else {
                index -= count;
            }
        }
        return 0;
    }   
}